

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  uint x;
  uint y;
  uint uVar7;
  char *pcVar8;
  stbi_uc *psVar9;
  stbi_uc *psVar10;
  uchar *puVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  byte *pbVar16;
  stbi_uc *psVar17;
  int *piVar18;
  uint uVar19;
  byte bVar20;
  byte bVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  long in_FS_OFFSET;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uint local_d4;
  stbi_uc local_c0 [4];
  int local_bc;
  stbi_uc *local_b8;
  uchar *local_b0;
  int *local_a8;
  stbi_uc *local_a0;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  psVar17 = s->img_buffer;
  psVar10 = s->img_buffer_end;
  iVar14 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    if (psVar17 < psVar10) {
      psVar17 = psVar17 + 1;
LAB_0014803c:
      s->img_buffer = psVar17;
    }
    else if (s->read_from_callbacks != 0) {
      iVar22 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar22 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        psVar10 = psVar2;
      }
      else {
        psVar10 = psVar1 + iVar22;
      }
      s->img_buffer_end = psVar10;
      psVar17 = psVar2;
      goto LAB_0014803c;
    }
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0014807a:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_001480d7:
      pcVar8 = "bad file";
      goto LAB_001480de;
    }
  }
  else {
    iVar14 = (*(s->io).eof)(s->io_user_data);
    if (iVar14 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_0014807a;
      goto LAB_001480d7;
    }
  }
  bVar21 = 0;
  uVar15 = 0;
  if ((y == 0) || (uVar15 = y * x, uVar15 < 0x20000000 && x <= (uint)(0x7fffffff / (ulong)y))) {
    local_bc = req_comp;
    local_a8 = comp;
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    local_b0 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    memset(local_b0,0xff,(ulong)(uVar15 << 2));
    pbVar16 = (byte *)(local_57 + 1);
    lVar23 = 0;
    local_a0 = psVar2;
    do {
      psVar2 = local_a0;
      if (lVar23 == 10) {
LAB_0014873d:
        pcVar8 = "bad format";
LAB_0014874d:
        *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
        goto LAB_00148769;
      }
      psVar17 = s->img_buffer;
      psVar10 = s->img_buffer_end;
      if (psVar17 < psVar10) {
        s->img_buffer = psVar17 + 1;
        bVar3 = *psVar17;
        psVar17 = psVar17 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar3 = 0;
      }
      else {
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar3 = 0;
          psVar10 = psVar2;
        }
        else {
          bVar3 = *psVar1;
          psVar10 = psVar1 + iVar14;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = psVar2;
        psVar17 = psVar2;
      }
      local_98 = lVar23;
      if (psVar17 < psVar10) {
        s->img_buffer = psVar17 + 1;
        bVar20 = *psVar17;
        psVar17 = psVar17 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar20 = 0;
      }
      else {
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar20 = 0;
          psVar10 = psVar2;
        }
        else {
          bVar20 = *psVar1;
          psVar10 = psVar1 + iVar14;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = psVar2;
        psVar17 = psVar2;
      }
      pbVar16[-2] = bVar20;
      if (psVar17 < psVar10) {
        s->img_buffer = psVar17 + 1;
        bVar24 = *psVar17;
        psVar17 = psVar17 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar24 = 0;
      }
      else {
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar24 = 0;
          psVar10 = psVar2;
        }
        else {
          bVar24 = *psVar1;
          psVar10 = psVar1 + iVar14;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = psVar2;
        psVar17 = psVar2;
      }
      pbVar16[-1] = bVar24;
      if (psVar17 < psVar10) {
        s->img_buffer = psVar17 + 1;
        bVar24 = *psVar17;
        psVar17 = psVar17 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar24 = 0;
      }
      else {
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar24 = 0;
          psVar10 = local_a0;
        }
        else {
          bVar24 = *psVar1;
          psVar10 = psVar1 + iVar14;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = local_a0;
        psVar17 = local_a0;
      }
      *pbVar16 = bVar24;
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00148346:
        if (psVar17 < psVar10) goto LAB_0014834f;
LAB_00148746:
        pcVar8 = "bad file";
        goto LAB_0014874d;
      }
      iVar14 = (*(s->io).eof)(s->io_user_data);
      if (iVar14 != 0) {
        if (s->read_from_callbacks != 0) {
          psVar17 = s->img_buffer;
          psVar10 = s->img_buffer_end;
          goto LAB_00148346;
        }
        goto LAB_00148746;
      }
LAB_0014834f:
      psVar2 = local_a0;
      if (bVar20 != 8) goto LAB_0014873d;
      bVar21 = bVar21 | bVar24;
      pbVar16 = pbVar16 + 3;
      lVar23 = local_98 + 1;
    } while (bVar3 != 0);
    local_84 = 4 - (uint)((bVar21 & 0x10) == 0);
    if (local_a8 != (int *)0x0) {
      *local_a8 = local_84;
    }
    if (y != 0) {
      local_88 = x * 4;
      local_80 = (ulong)y;
      uVar13 = 0;
      local_98 = lVar23;
      do {
        local_b8 = local_b0 + local_88 * (int)uVar13;
        lVar23 = 0;
        local_78 = uVar13;
        do {
          lVar6 = lVar23 * 3;
          cVar4 = local_57[lVar6];
          local_70 = lVar23;
          if (cVar4 == '\0') {
            if (x != 0) {
              bVar21 = local_57[lVar6 + 1];
              psVar17 = local_b8;
              uVar15 = x;
              do {
                psVar10 = stbi__readval(s,(uint)bVar21,psVar17);
                if (psVar10 == (stbi_uc *)0x0) goto LAB_00148769;
                psVar17 = psVar17 + 4;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
          }
          else if (cVar4 == '\x01') {
            psVar17 = local_b8;
            uVar15 = x;
            if (x != 0) {
LAB_001485a4:
              psVar10 = s->img_buffer;
              psVar9 = s->img_buffer_end;
              if (psVar10 < psVar9) {
                s->img_buffer = psVar10 + 1;
                local_d4 = (uint)*psVar10;
                psVar10 = psVar10 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                local_d4 = 0;
              }
              else {
                iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar14 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  local_d4 = 0;
                  psVar9 = psVar2;
                }
                else {
                  local_d4 = (uint)*psVar1;
                  psVar9 = psVar1 + iVar14;
                }
                s->img_buffer_end = psVar9;
                s->img_buffer = psVar2;
                psVar10 = psVar2;
              }
              if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00148654:
                if (psVar9 <= psVar10) goto LAB_001487c0;
LAB_0014865d:
                psVar10 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],local_c0);
                if (psVar10 == (stbi_uc *)0x0) goto LAB_00148769;
                if (uVar15 < local_d4) {
                  local_d4 = uVar15;
                }
                uVar7 = local_d4 & 0xff;
                if ((char)local_d4 != '\0') {
                  uVar12 = 0;
                  do {
                    bVar21 = local_57[lVar6 + 1];
                    uVar19 = 0x80;
                    lVar23 = 0;
                    do {
                      if ((uVar19 & bVar21) != 0) {
                        psVar17[lVar23] = local_c0[lVar23];
                      }
                      lVar23 = lVar23 + 1;
                      uVar19 = uVar19 >> 1;
                    } while (lVar23 != 4);
                    uVar12 = uVar12 + 1;
                    psVar17 = psVar17 + 4;
                  } while (uVar12 != uVar7);
                }
                uVar12 = uVar15 - uVar7;
                bVar5 = (int)uVar15 < (int)uVar7;
                uVar15 = uVar12;
                if (uVar12 == 0 || bVar5) goto LAB_001486f4;
                goto LAB_001485a4;
              }
              iVar14 = (*(s->io).eof)(s->io_user_data);
              if (iVar14 == 0) goto LAB_0014865d;
              if (s->read_from_callbacks != 0) {
                psVar10 = s->img_buffer;
                psVar9 = s->img_buffer_end;
                goto LAB_00148654;
              }
LAB_001487c0:
              pcVar8 = "bad file";
LAB_001487c7:
              *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
              goto LAB_00148769;
            }
          }
          else {
            if (cVar4 != '\x02') {
              pcVar8 = "bad format";
              goto LAB_001487c7;
            }
            psVar17 = local_b8;
            local_d4 = x;
            if (x != 0) {
              do {
                psVar10 = s->img_buffer;
                psVar9 = s->img_buffer_end;
                if (psVar10 < psVar9) {
                  s->img_buffer = psVar10 + 1;
                  bVar21 = *psVar10;
                  psVar10 = psVar10 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar21 = 0;
                }
                else {
                  iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar14 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar21 = 0;
                    psVar9 = psVar2;
                  }
                  else {
                    bVar21 = *psVar1;
                    psVar9 = psVar1 + iVar14;
                  }
                  s->img_buffer_end = psVar9;
                  s->img_buffer = psVar2;
                  psVar10 = psVar2;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001484c0:
                  if (psVar9 <= psVar10) goto LAB_001487c0;
                }
                else {
                  iVar14 = (*(s->io).eof)(s->io_user_data);
                  if (iVar14 != 0) {
                    if (s->read_from_callbacks != 0) {
                      psVar10 = s->img_buffer;
                      psVar9 = s->img_buffer_end;
                      goto LAB_001484c0;
                    }
                    goto LAB_001487c0;
                  }
                }
                uVar15 = (uint)bVar21;
                if ((char)bVar21 < '\0') {
                  if (uVar15 == 0x80) {
                    iVar14 = stbi__get16be(s);
                  }
                  else {
                    iVar14 = uVar15 - 0x7f;
                  }
                  if ((int)local_d4 < iVar14) goto LAB_001487c0;
                  psVar10 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],local_c0);
                  if (psVar10 == (stbi_uc *)0x0) goto LAB_00148769;
                  if (0 < iVar14) {
                    iVar22 = 0;
                    do {
                      bVar21 = local_57[lVar6 + 1];
                      uVar15 = 0x80;
                      lVar23 = 0;
                      do {
                        if ((uVar15 & bVar21) != 0) {
                          psVar17[lVar23] = local_c0[lVar23];
                        }
                        lVar23 = lVar23 + 1;
                        uVar15 = uVar15 >> 1;
                      } while (lVar23 != 4);
                      iVar22 = iVar22 + 1;
                      psVar17 = psVar17 + 4;
                    } while (iVar22 != iVar14);
                  }
                }
                else {
                  iVar22 = bVar21 + 1;
                  local_8c = iVar22;
                  if (local_d4 <= uVar15) goto LAB_001487c0;
                  do {
                    psVar10 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],psVar17);
                    if (psVar10 == (stbi_uc *)0x0) goto LAB_00148769;
                    psVar17 = psVar17 + 4;
                    iVar22 = iVar22 + -1;
                    iVar14 = local_8c;
                  } while (iVar22 != 0);
                }
                uVar15 = local_d4 - iVar14;
                bVar5 = iVar14 <= (int)local_d4;
                local_d4 = uVar15;
              } while (uVar15 != 0 && bVar5);
            }
          }
LAB_001486f4:
          lVar23 = local_70 + 1;
        } while (local_98 != lVar23);
        uVar13 = local_78 + 1;
      } while (uVar13 != local_80);
    }
    piVar18 = local_a8;
    puVar11 = local_b0;
    iVar14 = local_bc;
    if (local_b0 == (uchar *)0x0) {
LAB_00148769:
      piVar18 = local_a8;
      iVar14 = local_bc;
      free(local_b0);
      puVar11 = (uchar *)0x0;
    }
    *local_68 = x;
    *local_60 = y;
    iVar22 = local_84;
    if (iVar14 != 0) {
      iVar22 = iVar14;
    }
    if (iVar14 == 0 && piVar18 != (int *)0x0) {
      iVar22 = *piVar18;
    }
    puVar11 = stbi__convert_format(puVar11,4,iVar22,x,y);
    return puVar11;
  }
  pcVar8 = "too large";
LAB_001480de:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}